

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsmJsByteCodeGenerator.cpp
# Opt level: O3

EmitExpressionInfo __thiscall
Js::AsmJSByteCodeGenerator::EmitQMark(AsmJSByteCodeGenerator *this,ParseNode *pnode)

{
  AsmJsByteCodeWriter *this_00;
  AsmJsType *pAVar1;
  AsmJsFunc *pAVar2;
  ParseNode *this_01;
  RegSlot RVar3;
  bool bVar4;
  ByteCodeLabel trueLabel;
  ByteCodeLabel falseLabel;
  Types TVar5;
  ParseNodeTri *pPVar6;
  RegisterSpace *pRVar7;
  AsmJsCompilationException *this_02;
  TypedRegisterAllocator *this_03;
  EmitExpressionInfo local_78;
  ByteCodeLabel local_6c;
  ulong local_68;
  ParseNode *local_60;
  EmitExpressionInfo local_58;
  uint local_4c;
  EmitExpressionInfo local_48;
  ByteCodeLabel local_40;
  RegSlot local_3c;
  RegSlot local_38;
  RegSlot local_34;
  
  pPVar6 = ParseNode::AsParseNodeTri(pnode);
  this_00 = &this->mWriter;
  ByteCodeWriter::StartStatement(&this_00->super_ByteCodeWriter,pPVar6->pnode1,0);
  trueLabel = ByteCodeWriter::DefineLabel(&this_00->super_ByteCodeWriter);
  local_60 = (ParseNode *)CONCAT44(local_60._4_4_,trueLabel);
  falseLabel = ByteCodeWriter::DefineLabel(&this_00->super_ByteCodeWriter);
  local_40 = ByteCodeWriter::DefineLabel(&this_00->super_ByteCodeWriter);
  pPVar6 = ParseNode::AsParseNodeTri(pnode);
  ByteCodeWriter::EndStatement(&this_00->super_ByteCodeWriter,pPVar6->pnode1);
  pPVar6 = ParseNode::AsParseNodeTri(pnode);
  local_6c = falseLabel;
  local_78 = EmitBooleanExpression(this,pPVar6->pnode1,trueLabel,falseLabel);
  AsmJsFunc::ReleaseLocationGeneric(this->mFunction,&local_78);
  pAVar2 = this->mFunction;
  TVar5 = WAsmJs::FromPrimitiveType<int>();
  pRVar7 = WAsmJs::TypedRegisterAllocator::GetRegisterSpace(&pAVar2->mTypedRegisterAllocator,TVar5);
  local_3c = WAsmJs::RegisterSpace::AcquireTmpRegister(pRVar7);
  pAVar2 = this->mFunction;
  TVar5 = WAsmJs::FromPrimitiveType<double>();
  pRVar7 = WAsmJs::TypedRegisterAllocator::GetRegisterSpace(&pAVar2->mTypedRegisterAllocator,TVar5);
  local_38 = WAsmJs::RegisterSpace::AcquireTmpRegister(pRVar7);
  pAVar2 = this->mFunction;
  TVar5 = WAsmJs::FromPrimitiveType<float>();
  pRVar7 = WAsmJs::TypedRegisterAllocator::GetRegisterSpace(&pAVar2->mTypedRegisterAllocator,TVar5);
  local_34 = WAsmJs::RegisterSpace::AcquireTmpRegister(pRVar7);
  AsmJsByteCodeWriter::MarkAsmJsLabel(this_00,(ByteCodeLabel)local_60);
  pPVar6 = ParseNode::AsParseNodeTri(pnode);
  local_48 = Emit(this,pPVar6->pnode2);
  pAVar1 = &local_48.type;
  local_60 = pnode;
  pPVar6 = ParseNode::AsParseNodeTri(pnode);
  ByteCodeWriter::StartStatement(&this_00->super_ByteCodeWriter,pPVar6->pnode2,0);
  bVar4 = AsmJsType::isInt(pAVar1);
  if (bVar4) {
    AsmJsByteCodeWriter::AsmReg2(this_00,Ld_Int,local_3c,local_48.super_EmitInfoBase.location);
    pAVar2 = this->mFunction;
    TVar5 = WAsmJs::FromPrimitiveType<int>();
    pRVar7 = WAsmJs::TypedRegisterAllocator::GetRegisterSpace
                       (&pAVar2->mTypedRegisterAllocator,TVar5);
    if (local_48.super_EmitInfoBase.location != 0xffffffff) {
      WAsmJs::RegisterSpace::ReleaseTmpRegister(pRVar7,local_48.super_EmitInfoBase.location);
    }
    pAVar2 = this->mFunction;
    TVar5 = WAsmJs::FromPrimitiveType<double>();
    pRVar7 = WAsmJs::TypedRegisterAllocator::GetRegisterSpace
                       (&pAVar2->mTypedRegisterAllocator,TVar5);
    WAsmJs::RegisterSpace::ReleaseTmpRegister(pRVar7,local_38);
    pAVar2 = this->mFunction;
    TVar5 = WAsmJs::FromPrimitiveType<float>();
    pRVar7 = WAsmJs::TypedRegisterAllocator::GetRegisterSpace
                       (&pAVar2->mTypedRegisterAllocator,TVar5);
    WAsmJs::RegisterSpace::ReleaseTmpRegister(pRVar7,local_34);
    local_68 = 0;
    local_4c = local_3c;
  }
  else {
    bVar4 = AsmJsType::isDouble(pAVar1);
    if (bVar4) {
      AsmJsByteCodeWriter::AsmReg2(this_00,Ld_Db,local_38,local_48.super_EmitInfoBase.location);
      pAVar2 = this->mFunction;
      TVar5 = WAsmJs::FromPrimitiveType<double>();
      pRVar7 = WAsmJs::TypedRegisterAllocator::GetRegisterSpace
                         (&pAVar2->mTypedRegisterAllocator,TVar5);
      RVar3 = local_3c;
      if (local_48.super_EmitInfoBase.location != 0xffffffff) {
        WAsmJs::RegisterSpace::ReleaseTmpRegister(pRVar7,local_48.super_EmitInfoBase.location);
      }
      pAVar2 = this->mFunction;
      TVar5 = WAsmJs::FromPrimitiveType<int>();
      pRVar7 = WAsmJs::TypedRegisterAllocator::GetRegisterSpace
                         (&pAVar2->mTypedRegisterAllocator,TVar5);
      WAsmJs::RegisterSpace::ReleaseTmpRegister(pRVar7,RVar3);
      pAVar2 = this->mFunction;
      TVar5 = WAsmJs::FromPrimitiveType<float>();
      pRVar7 = WAsmJs::TypedRegisterAllocator::GetRegisterSpace
                         (&pAVar2->mTypedRegisterAllocator,TVar5);
      WAsmJs::RegisterSpace::ReleaseTmpRegister(pRVar7,local_34);
      local_68 = 0x200000000;
      local_4c = local_38;
    }
    else {
      bVar4 = AsmJsType::isFloat(pAVar1);
      RVar3 = local_3c;
      if (!bVar4) {
        this_02 = (AsmJsCompilationException *)__cxa_allocate_exception(0x200);
        AsmJsCompilationException::AsmJsCompilationException
                  (this_02,L"Conditional expressions must be of type int, double, or float");
        goto LAB_009399a1;
      }
      AsmJsByteCodeWriter::AsmReg2(this_00,Ld_Flt,local_34,local_48.super_EmitInfoBase.location);
      pAVar2 = this->mFunction;
      TVar5 = WAsmJs::FromPrimitiveType<float>();
      pRVar7 = WAsmJs::TypedRegisterAllocator::GetRegisterSpace
                         (&pAVar2->mTypedRegisterAllocator,TVar5);
      if (local_48.super_EmitInfoBase.location != 0xffffffff) {
        WAsmJs::RegisterSpace::ReleaseTmpRegister(pRVar7,local_48.super_EmitInfoBase.location);
      }
      pAVar2 = this->mFunction;
      TVar5 = WAsmJs::FromPrimitiveType<int>();
      pRVar7 = WAsmJs::TypedRegisterAllocator::GetRegisterSpace
                         (&pAVar2->mTypedRegisterAllocator,TVar5);
      WAsmJs::RegisterSpace::ReleaseTmpRegister(pRVar7,RVar3);
      pAVar2 = this->mFunction;
      TVar5 = WAsmJs::FromPrimitiveType<double>();
      pRVar7 = WAsmJs::TypedRegisterAllocator::GetRegisterSpace
                         (&pAVar2->mTypedRegisterAllocator,TVar5);
      WAsmJs::RegisterSpace::ReleaseTmpRegister(pRVar7,local_38);
      local_68 = 0x300000000;
      local_4c = local_34;
    }
  }
  AsmJsByteCodeWriter::AsmBr(this_00,local_40,AsmBr);
  this_01 = local_60;
  pPVar6 = ParseNode::AsParseNodeTri(local_60);
  ByteCodeWriter::EndStatement(&this_00->super_ByteCodeWriter,pPVar6->pnode2);
  AsmJsByteCodeWriter::MarkAsmJsLabel(this_00,local_6c);
  pPVar6 = ParseNode::AsParseNodeTri(this_01);
  local_58 = Emit(this,pPVar6->pnode3);
  pAVar1 = &local_58.type;
  pPVar6 = ParseNode::AsParseNodeTri(this_01);
  ByteCodeWriter::StartStatement(&this_00->super_ByteCodeWriter,pPVar6->pnode3,0);
  bVar4 = AsmJsType::isInt(pAVar1);
  if (bVar4) {
    bVar4 = AsmJsType::isInt(&local_48.type);
    if (bVar4) {
      AsmJsByteCodeWriter::AsmReg2(this_00,Ld_Int,local_3c,local_58.super_EmitInfoBase.location);
      this_03 = &this->mFunction->mTypedRegisterAllocator;
      TVar5 = WAsmJs::FromPrimitiveType<int>();
LAB_009398b0:
      pRVar7 = WAsmJs::TypedRegisterAllocator::GetRegisterSpace(this_03,TVar5);
      if (local_58.super_EmitInfoBase.location != 0xffffffff) {
        WAsmJs::RegisterSpace::ReleaseTmpRegister(pRVar7,local_58.super_EmitInfoBase.location);
      }
      AsmJsByteCodeWriter::MarkAsmJsLabel(this_00,local_40);
      pPVar6 = ParseNode::AsParseNodeTri(local_60);
      ByteCodeWriter::EndStatement(&this_00->super_ByteCodeWriter,pPVar6->pnode3);
      return (EmitExpressionInfo)(local_68 | local_4c);
    }
    this_02 = (AsmJsCompilationException *)__cxa_allocate_exception(0x200);
    AsmJsCompilationException::AsmJsCompilationException
              (this_02,L"Conditional expressions results must be the same type");
  }
  else {
    bVar4 = AsmJsType::isDouble(pAVar1);
    if (bVar4) {
      bVar4 = AsmJsType::isDouble(&local_48.type);
      if (bVar4) {
        AsmJsByteCodeWriter::AsmReg2(this_00,Ld_Db,local_38,local_58.super_EmitInfoBase.location);
        this_03 = &this->mFunction->mTypedRegisterAllocator;
        TVar5 = WAsmJs::FromPrimitiveType<double>();
        goto LAB_009398b0;
      }
      this_02 = (AsmJsCompilationException *)__cxa_allocate_exception(0x200);
      AsmJsCompilationException::AsmJsCompilationException
                (this_02,L"Conditional expressions results must be the same type");
    }
    else {
      bVar4 = AsmJsType::isFloat(pAVar1);
      if (bVar4) {
        bVar4 = AsmJsType::isFloat(&local_48.type);
        if (bVar4) {
          AsmJsByteCodeWriter::AsmReg2(this_00,Ld_Flt,local_34,local_58.super_EmitInfoBase.location)
          ;
          this_03 = &this->mFunction->mTypedRegisterAllocator;
          TVar5 = WAsmJs::FromPrimitiveType<float>();
          goto LAB_009398b0;
        }
        this_02 = (AsmJsCompilationException *)__cxa_allocate_exception(0x200);
        AsmJsCompilationException::AsmJsCompilationException
                  (this_02,L"Conditional expressions results must be the same type");
      }
      else {
        this_02 = (AsmJsCompilationException *)__cxa_allocate_exception(0x200);
        AsmJsCompilationException::AsmJsCompilationException
                  (this_02,L"Conditional expressions must be of type int, double, or float");
      }
    }
  }
LAB_009399a1:
  __cxa_throw(this_02,&AsmJsCompilationException::typeinfo,0);
}

Assistant:

EmitExpressionInfo AsmJSByteCodeGenerator::EmitQMark( ParseNode * pnode )
    {
        StartStatement(pnode->AsParseNodeTri()->pnode1);
        Js::ByteCodeLabel trueLabel = mWriter.DefineLabel();
        Js::ByteCodeLabel falseLabel = mWriter.DefineLabel();
        Js::ByteCodeLabel skipLabel = mWriter.DefineLabel();
        EndStatement(pnode->AsParseNodeTri()->pnode1);
        const EmitExpressionInfo& boolInfo = EmitBooleanExpression( pnode->AsParseNodeTri()->pnode1, trueLabel, falseLabel );
        mFunction->ReleaseLocationGeneric( &boolInfo );

        RegSlot intReg = mFunction->AcquireTmpRegister<int>();
        RegSlot doubleReg = mFunction->AcquireTmpRegister<double>();
        RegSlot floatReg = mFunction->AcquireTmpRegister<float>();
        EmitExpressionInfo emitInfo( AsmJsType::Void );


        mWriter.MarkAsmJsLabel( trueLabel );
        const EmitExpressionInfo& trueInfo = Emit( pnode->AsParseNodeTri()->pnode2 );
        StartStatement(pnode->AsParseNodeTri()->pnode2);
        if( trueInfo.type.isInt() )
        {
            mWriter.AsmReg2( Js::OpCodeAsmJs::Ld_Int, intReg, trueInfo.location );
            mFunction->ReleaseLocation<int>( &trueInfo );
            mFunction->ReleaseTmpRegister<double>(doubleReg);
            mFunction->ReleaseTmpRegister<float>(floatReg);
            emitInfo.location = intReg;
            emitInfo.type = AsmJsType::Int;
        }
        else if( trueInfo.type.isDouble() )
        {
            mWriter.AsmReg2( Js::OpCodeAsmJs::Ld_Db, doubleReg, trueInfo.location );
            mFunction->ReleaseLocation<double>( &trueInfo );
            mFunction->ReleaseTmpRegister<int>( intReg );
            mFunction->ReleaseTmpRegister<float>(floatReg);
            emitInfo.location = doubleReg;
            emitInfo.type = AsmJsType::Double;
        }
        else if (trueInfo.type.isFloat())
        {
            mWriter.AsmReg2(Js::OpCodeAsmJs::Ld_Flt, floatReg, trueInfo.location);
            mFunction->ReleaseLocation<float>(&trueInfo);
            mFunction->ReleaseTmpRegister<int>(intReg);
            mFunction->ReleaseTmpRegister<double>(doubleReg);
            emitInfo.location = floatReg;
            emitInfo.type = AsmJsType::Float;
        }
        else
        {
            throw AsmJsCompilationException(_u("Conditional expressions must be of type int, double, or float"));
        }
        mWriter.AsmBr( skipLabel );
        EndStatement(pnode->AsParseNodeTri()->pnode2);
        mWriter.MarkAsmJsLabel( falseLabel );
        const EmitExpressionInfo& falseInfo = Emit( pnode->AsParseNodeTri()->pnode3 );
        StartStatement(pnode->AsParseNodeTri()->pnode3);
        if( falseInfo.type.isInt() )
        {
            if( !trueInfo.type.isInt() )
            {
                throw AsmJsCompilationException( _u("Conditional expressions results must be the same type") );
            }
            mWriter.AsmReg2( Js::OpCodeAsmJs::Ld_Int, intReg, falseInfo.location );
            mFunction->ReleaseLocation<int>( &falseInfo );
        }
        else if( falseInfo.type.isDouble() )
        {
            if( !trueInfo.type.isDouble() )
            {
                throw AsmJsCompilationException( _u("Conditional expressions results must be the same type") );
            }
            mWriter.AsmReg2( Js::OpCodeAsmJs::Ld_Db, doubleReg, falseInfo.location );
            mFunction->ReleaseLocation<double>( &falseInfo );
        }
        else if(falseInfo.type.isFloat())
        {
            if (!trueInfo.type.isFloat())
            {
                throw AsmJsCompilationException(_u("Conditional expressions results must be the same type"));
            }
            mWriter.AsmReg2(Js::OpCodeAsmJs::Ld_Flt, floatReg, falseInfo.location);
            mFunction->ReleaseLocation<float>(&falseInfo);
        }
        else
        {
            throw AsmJsCompilationException(_u("Conditional expressions must be of type int, double, or float"));
        }
        mWriter.MarkAsmJsLabel( skipLabel );
        EndStatement(pnode->AsParseNodeTri()->pnode3);
        return emitInfo;
    }